

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode DecodeInto(uint8_t *data,size_t data_size,WebPDecParams *params)

{
  int iVar1;
  VP8LDecoder *io_00;
  WebPDecParams *in_RDX;
  WebPDecBuffer *in_RSI;
  WebPHeaderStructure *in_RDI;
  VP8LDecoder *dec_1;
  VP8Decoder *dec;
  WebPHeaderStructure headers;
  VP8Io io;
  VP8StatusCode status;
  VP8Io *in_stack_fffffffffffffee0;
  VP8Decoder *in_stack_fffffffffffffee8;
  int iVar2;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  size_t local_e8;
  int local_d0;
  VP8Io local_c8;
  VP8StatusCode local_24;
  WebPDecParams *local_20;
  VP8StatusCode local_4;
  
  iVar2 = 1;
  local_20 = in_RDX;
  local_24 = WebPParseHeaders(in_RDI);
  local_4 = local_24;
  if (local_24 == VP8_STATUS_OK) {
    iVar1 = VP8InitIo((VP8Io *)0x103dc9);
    if (iVar1 == 0) {
      local_4 = VP8_STATUS_INVALID_PARAM;
    }
    else {
      local_c8.data =
           (uint8_t *)
           ((long)&in_RDI->data + CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_c8.data_size =
           (long)in_RSI - CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      WebPInitCustomIo(local_20,&local_c8);
      if (local_d0 == 0) {
        in_stack_fffffffffffffee8 = VP8New();
        if (in_stack_fffffffffffffee8 == (VP8Decoder *)0x0) {
          return VP8_STATUS_OUT_OF_MEMORY;
        }
        in_stack_fffffffffffffee8->alpha_data =
             (uint8_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        in_stack_fffffffffffffee8->alpha_data_size = local_e8;
        iVar1 = VP8GetHeaders((VP8Decoder *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                              (VP8Io *)CONCAT44(in_stack_ffffffffffffff04,iVar2));
        if (iVar1 == 0) {
          local_24 = in_stack_fffffffffffffee8->status;
        }
        else {
          local_24 = WebPAllocateDecBuffer
                               (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                (WebPDecoderOptions *)CONCAT44(in_stack_ffffffffffffff04,iVar2),
                                in_RSI);
          if (local_24 == VP8_STATUS_OK) {
            iVar2 = VP8GetThreadMethod(local_20->options,
                                       (WebPHeaderStructure *)&stack0xfffffffffffffef0,
                                       local_c8.width,local_c8.height);
            in_stack_fffffffffffffee8->mt_method = iVar2;
            VP8InitDithering((WebPDecoderOptions *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             (VP8Decoder *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            iVar2 = VP8Decode(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            if (iVar2 == 0) {
              local_24 = in_stack_fffffffffffffee8->status;
            }
          }
        }
        VP8Delete((VP8Decoder *)0x103f30);
      }
      else {
        io_00 = VP8LNew();
        if (io_00 == (VP8LDecoder *)0x0) {
          return VP8_STATUS_OUT_OF_MEMORY;
        }
        iVar1 = VP8LDecodeHeader((VP8LDecoder *)in_stack_fffffffffffffee8,(VP8Io *)io_00);
        if (iVar1 == 0) {
          local_24 = io_00->status;
        }
        else {
          local_24 = WebPAllocateDecBuffer
                               (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                (WebPDecoderOptions *)CONCAT44(in_stack_ffffffffffffff04,iVar2),
                                in_RSI);
          if ((local_24 == VP8_STATUS_OK) &&
             (iVar2 = VP8LDecodeImage((VP8LDecoder *)in_stack_fffffffffffffee8), iVar2 == 0)) {
            local_24 = io_00->status;
          }
        }
        VP8LDelete((VP8LDecoder *)0x103fdb);
      }
      if (local_24 == VP8_STATUS_OK) {
        if ((local_20->options != (WebPDecoderOptions *)0x0) && (local_20->options->flip != 0)) {
          local_24 = WebPFlipBuffer((WebPDecBuffer *)in_stack_fffffffffffffee8);
        }
      }
      else {
        WebPFreeDecBuffer((WebPDecBuffer *)0x103ff5);
      }
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

WEBP_NODISCARD static VP8StatusCode DecodeInto(const uint8_t* const data,
                                               size_t data_size,
                                               WebPDecParams* const params) {
  VP8StatusCode status;
  VP8Io io;
  WebPHeaderStructure headers;

  headers.data = data;
  headers.data_size = data_size;
  headers.have_all_data = 1;
  status = WebPParseHeaders(&headers);   // Process Pre-VP8 chunks.
  if (status != VP8_STATUS_OK) {
    return status;
  }

  assert(params != NULL);
  if (!VP8InitIo(&io)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  io.data = headers.data + headers.offset;
  io.data_size = headers.data_size - headers.offset;
  WebPInitCustomIo(params, &io);  // Plug the I/O functions.

  if (!headers.is_lossless) {
    VP8Decoder* const dec = VP8New();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    dec->alpha_data = headers.alpha_data;
    dec->alpha_data_size = headers.alpha_data_size;

    // Decode bitstream header, update io->width/io->height.
    if (!VP8GetHeaders(dec, &io)) {
      status = dec->status;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        // This change must be done before calling VP8Decode()
        dec->mt_method = VP8GetThreadMethod(params->options, &headers,
                                            io.width, io.height);
        VP8InitDithering(params->options, dec);
        if (!VP8Decode(dec, &io)) {
          status = dec->status;
        }
      }
    }
    VP8Delete(dec);
  } else {
    VP8LDecoder* const dec = VP8LNew();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    if (!VP8LDecodeHeader(dec, &io)) {
      status = dec->status;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        if (!VP8LDecodeImage(dec)) {
          status = dec->status;
        }
      }
    }
    VP8LDelete(dec);
  }

  if (status != VP8_STATUS_OK) {
    WebPFreeDecBuffer(params->output);
  } else {
    if (params->options != NULL && params->options->flip) {
      // This restores the original stride values if options->flip was used
      // during the call to WebPAllocateDecBuffer above.
      status = WebPFlipBuffer(params->output);
    }
  }
  return status;
}